

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilInfoCompare(Sim_Man_t *p,Abc_Obj_t *pNode)

{
  int local_34;
  int k;
  uint *pSimInfo2;
  uint *pSimInfo1;
  Abc_Obj_t *pNode_local;
  Sim_Man_t *p_local;
  
  local_34 = 0;
  while( true ) {
    if (p->nSimWords <= local_34) {
      return 1;
    }
    if (*(int *)((long)p->vSim1->pArray[pNode->Id] + (long)local_34 * 4) !=
        *(int *)((long)p->vSim0->pArray[pNode->Id] + (long)local_34 * 4)) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int Sim_UtilInfoCompare( Sim_Man_t * p, Abc_Obj_t * pNode )
{
    unsigned * pSimInfo1, * pSimInfo2;
    int k;
    pSimInfo1 = (unsigned *)p->vSim0->pArray[pNode->Id];
    pSimInfo2 = (unsigned *)p->vSim1->pArray[pNode->Id];
    for ( k = 0; k < p->nSimWords; k++ )
        if ( pSimInfo2[k] != pSimInfo1[k] )
            return 0;
    return 1;
}